

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_18d51b::AbiTagAttr::printLeft(AbiTagAttr *this,OutputStream *S)

{
  StringView R;
  StringView R_00;
  
  (*this->Base->_vptr_Node[4])();
  R.Last = "";
  R.First = "[abi:";
  OutputStream::operator+=(S,R);
  OutputStream::operator+=(S,this->Tag);
  R_00.Last = "";
  R_00.First = "]";
  OutputStream::operator+=(S,R_00);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    Base->printLeft(S);
    S += "[abi:";
    S += Tag;
    S += "]";
  }